

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

void process_single_ref_mv_candidate
               (MB_MODE_INFO *candidate,AV1_COMMON *cm,MV_REFERENCE_FRAME ref_frame,
               uint8_t *refmv_count,CANDIDATE_MV *ref_mv_stack,uint16_t *ref_mv_weight)

{
  int_mv stack_mv;
  int stack_idx;
  int_mv this_mv;
  int rf_idx;
  uint16_t *ref_mv_weight_local;
  CANDIDATE_MV *ref_mv_stack_local;
  uint8_t *refmv_count_local;
  MV_REFERENCE_FRAME ref_frame_local;
  AV1_COMMON *cm_local;
  MB_MODE_INFO *candidate_local;
  
  for (rf_idx = 0; rf_idx < 2; rf_idx = rf_idx + 1) {
    if ('\0' < candidate->ref_frame[rf_idx]) {
      this_mv = (int_mv)*(int_mv *)&candidate->mv[rf_idx].as_mv;
      if (cm->ref_frame_sign_bias[candidate->ref_frame[rf_idx]] !=
          cm->ref_frame_sign_bias[ref_frame]) {
        this_mv.as_mv.col = -this_mv.as_mv.col;
        this_mv.as_mv.row = -this_mv.as_mv.row;
      }
      stack_idx = 0;
      while ((stack_idx < (int)(uint)*refmv_count &&
             (this_mv.as_int != ref_mv_stack[stack_idx].this_mv.as_int))) {
        stack_idx = stack_idx + 1;
      }
      if (stack_idx == (uint)*refmv_count) {
        ref_mv_stack[stack_idx].this_mv = this_mv;
        ref_mv_weight[stack_idx] = 2;
        *refmv_count = *refmv_count + '\x01';
      }
    }
  }
  return;
}

Assistant:

static inline void process_single_ref_mv_candidate(
    const MB_MODE_INFO *const candidate, const AV1_COMMON *const cm,
    MV_REFERENCE_FRAME ref_frame, uint8_t *const refmv_count,
    CANDIDATE_MV ref_mv_stack[MAX_REF_MV_STACK_SIZE],
    uint16_t ref_mv_weight[MAX_REF_MV_STACK_SIZE]) {
  for (int rf_idx = 0; rf_idx < 2; ++rf_idx) {
    if (candidate->ref_frame[rf_idx] > INTRA_FRAME) {
      int_mv this_mv = candidate->mv[rf_idx];
      if (cm->ref_frame_sign_bias[candidate->ref_frame[rf_idx]] !=
          cm->ref_frame_sign_bias[ref_frame]) {
        this_mv.as_mv.row = -this_mv.as_mv.row;
        this_mv.as_mv.col = -this_mv.as_mv.col;
      }
      int stack_idx;
      for (stack_idx = 0; stack_idx < *refmv_count; ++stack_idx) {
        const int_mv stack_mv = ref_mv_stack[stack_idx].this_mv;
        if (this_mv.as_int == stack_mv.as_int) break;
      }

      if (stack_idx == *refmv_count) {
        ref_mv_stack[stack_idx].this_mv = this_mv;

        // TODO(jingning): Set an arbitrary small number here. The weight
        // doesn't matter as long as it is properly initialized.
        ref_mv_weight[stack_idx] = 2;
        ++(*refmv_count);
      }
    }
  }
}